

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall
leveldb::InternalFilterPolicy::CreateFilter
          (InternalFilterPolicy *this,Slice *keys,int n,string *dst)

{
  undefined8 *puVar1;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  Slice *mkey;
  Slice *internal_key;
  Slice local_40;
  size_t sStack_38;
  int local_2c;
  
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    local_40 = ExtractUserKey(internal_key);
    puVar1 = (undefined8 *)(in_RSI + (long)local_2c * 0x10);
    *puVar1 = internal_key;
    puVar1[1] = sStack_38;
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),in_RSI,in_EDX,in_RCX);
  return;
}

Assistant:

void InternalFilterPolicy::CreateFilter(const Slice* keys, int n,
                                        std::string* dst) const {
  // We rely on the fact that the code in table.cc does not mind us
  // adjusting keys[].
  Slice* mkey = const_cast<Slice*>(keys);
  for (int i = 0; i < n; i++) {
    mkey[i] = ExtractUserKey(keys[i]);
    // TODO(sanjay): Suppress dups?
  }
  user_policy_->CreateFilter(keys, n, dst);
}